

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O0

int32_t icu_63::CollationBuilder::countTailoredNodes(int64_t *nodesArray,int32_t i,int32_t strength)

{
  int64_t node_00;
  UBool UVar1;
  int32_t iVar2;
  int64_t node;
  int32_t count;
  int32_t strength_local;
  int32_t i_local;
  int64_t *nodesArray_local;
  
  node._4_4_ = 0;
  count = i;
  while( true ) {
    if (count == 0) {
      return node._4_4_;
    }
    node_00 = nodesArray[count];
    iVar2 = strengthFromNode(node_00);
    if (iVar2 < strength) break;
    iVar2 = strengthFromNode(node_00);
    if (iVar2 == strength) {
      UVar1 = isTailoredNode(node_00);
      if (UVar1 == '\0') {
        return node._4_4_;
      }
      node._4_4_ = node._4_4_ + 1;
    }
    count = nextIndexFromNode(node_00);
  }
  return node._4_4_;
}

Assistant:

int32_t
CollationBuilder::countTailoredNodes(const int64_t *nodesArray, int32_t i, int32_t strength) {
    int32_t count = 0;
    for(;;) {
        if(i == 0) { break; }
        int64_t node = nodesArray[i];
        if(strengthFromNode(node) < strength) { break; }
        if(strengthFromNode(node) == strength) {
            if(isTailoredNode(node)) {
                ++count;
            } else {
                break;
            }
        }
        i = nextIndexFromNode(node);
    }
    return count;
}